

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::storage<baryonyx::itm::quadratic_cost_type<float>,_baryonyx::itm::maximize_tag>::
crossover(storage<baryonyx::itm::quadratic_cost_type<float>,_baryonyx::itm::maximize_tag> *this,
         local_context *ctx,bit_array *x)

{
  result_type_conflict2 rVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  pointer prVar5;
  bit_array_impl *other;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_double>
  __aurng;
  double dVar6;
  string_view fmt;
  string_view fmt_00;
  uint indent;
  double *in_stack_ffffffffffffffb8;
  int first;
  int second;
  m_indices_reader lock;
  
  lock._M_owns = true;
  lock._M_pm = &this->m_indices_mutex;
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  rVar1 = std::bernoulli_distribution::operator()(&ctx->crossover_bastert_insertion,&ctx->rng);
  if (!rVar1) {
    iVar2 = choose_a_solution(this,ctx);
    iVar2 = (this->m_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar2];
    first = iVar2;
    iVar3 = choose_a_solution(this,ctx);
    while( true ) {
      iVar3 = (this->m_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar3];
      second = iVar3;
      if (iVar2 != iVar3) break;
      iVar3 = choose_a_solution(this,ctx);
    }
    prVar5 = (this->m_data).
             super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    crossover(this,ctx,x,&prVar5[iVar2].x,&prVar5[iVar3].x);
    prVar5 = (this->m_data).
             super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    fmt._M_str = (char *)&first;
    fmt._M_len = (size_t)"- crossover between {} ({}) and {} ({})\n";
    to_log<int,double,int,double>
              (_stdout,(FILE *)0x7,0x28,fmt,(int *)&prVar5[iVar2].value,(double *)&second,
               (int *)&prVar5[iVar3].value,in_stack_ffffffffffffffb8);
    goto LAB_00148a16;
  }
  iVar2 = choose_a_solution(this,ctx);
  first = (this->m_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar2];
  dVar6 = std::
          generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                    (&ctx->rng);
  if (0.5 <= dVar6) {
    other = &(this->m_random).super_bit_array_impl;
    init_with_random((bit_array *)other,&ctx->rng,(x->super_bit_array_impl).m_size,0.5);
    dVar6 = std::
            generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                      (&ctx->rng);
    prVar5 = (this->m_data).
             super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
             ._M_impl.super__Vector_impl_data._M_start + first;
    if (0.5 <= dVar6) goto LAB_00148a0b;
    crossover(this,ctx,x,&prVar5->x,(bit_array *)other);
    pcVar4 = "- crossover between {} ({}) and random\n";
    indent = 0x27;
  }
  else {
    dVar6 = std::
            generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                      (&ctx->rng);
    if (0.5 <= dVar6) {
      prVar5 = (this->m_data).
               super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
               ._M_impl.super__Vector_impl_data._M_start + first;
      other = &(this->m_bastert).super_bit_array_impl;
LAB_00148a0b:
      bit_array_impl::operator=((bit_array_impl *)prVar5,other);
      goto LAB_00148a16;
    }
    crossover(this,ctx,x,
              &(this->m_data).
               super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
               ._M_impl.super__Vector_impl_data._M_start[first].x,&this->m_bastert);
    pcVar4 = "- crossover between {} ({}) and bastert\n";
    indent = 0x28;
  }
  fmt_00._M_str = (char *)&first;
  fmt_00._M_len = (size_t)pcVar4;
  to_log<int,double>(_stdout,(FILE *)0x7,indent,fmt_00,
                     (int *)&(this->m_data).
                             super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[first].value,
                     in_stack_ffffffffffffffb8);
LAB_00148a16:
  std::shared_lock<std::shared_mutex>::~shared_lock(&lock);
  return;
}

Assistant:

void crossover(local_context& ctx, bit_array& x)
    {
        m_indices_reader lock(m_indices_mutex);

        if (ctx.crossover_bastert_insertion(ctx.rng)) {
            int first = m_indices[choose_a_solution(ctx)];
            std::bernoulli_distribution b(0.5);

            if (b(ctx.rng)) {
                if (b(ctx.rng)) {
                    crossover(ctx, x, m_data[first].x, m_bastert);
                    to_log(stdout,
                           7u,
                           "- crossover between {} ({}) and bastert\n",
                           first,
                           m_data[first].value);
                } else {
                    m_data[first].x = m_bastert;
                }
            } else {
                init_with_random(m_random, ctx.rng, x.size(), 0.5);
                if (b(ctx.rng)) {
                    crossover(ctx, x, m_data[first].x, m_random);
                    to_log(stdout,
                           7u,
                           "- crossover between {} ({}) and random\n",
                           first,
                           m_data[first].value);
                } else {
                    m_data[first].x = m_random;
                }
            }
        } else {
            int first = m_indices[choose_a_solution(ctx)];
            int second = m_indices[choose_a_solution(ctx)];
            while (first == second)
                second = m_indices[choose_a_solution(ctx)];

            crossover(ctx, x, m_data[first].x, m_data[second].x);

            to_log(stdout,
                   7u,
                   "- crossover between {} ({}) and {} ({})\n",
                   first,
                   m_data[first].value,
                   second,
                   m_data[second].value);
        }
    }